

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnitIndex.cpp
# Opt level: O1

SectionContribution * __thiscall
llvm::DWARFUnitIndex::Entry::getOffset(Entry *this,DWARFSectionKind Sec)

{
  uint32_t uVar1;
  long lVar2;
  long lVar3;
  
  uVar1 = (this->Index->Header).NumColumns;
  if (uVar1 != 0) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      if ((this->Index->ColumnKinds)._M_t.
          super___uniq_ptr_impl<llvm::DWARFSectionKind,_std::default_delete<llvm::DWARFSectionKind[]>_>
          ._M_t.
          super__Tuple_impl<0UL,_llvm::DWARFSectionKind_*,_std::default_delete<llvm::DWARFSectionKind[]>_>
          .super__Head_base<0UL,_llvm::DWARFSectionKind_*,_false>._M_head_impl[lVar3] == Sec) {
        return (SectionContribution *)
               ((long)(this->Contributions)._M_t.
                      super___uniq_ptr_impl<llvm::DWARFUnitIndex::Entry::SectionContribution,_std::default_delete<llvm::DWARFUnitIndex::Entry::SectionContribution[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_llvm::DWARFUnitIndex::Entry::SectionContribution_*,_std::default_delete<llvm::DWARFUnitIndex::Entry::SectionContribution[]>_>
                      .
                      super__Head_base<0UL,_llvm::DWARFUnitIndex::Entry::SectionContribution_*,_false>
                      ._M_head_impl - lVar2);
      }
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + -8;
    } while (uVar1 != (uint32_t)lVar3);
  }
  return (SectionContribution *)0x0;
}

Assistant:

const DWARFUnitIndex::Entry::SectionContribution *
DWARFUnitIndex::Entry::getOffset(DWARFSectionKind Sec) const {
  uint32_t i = 0;
  for (; i != Index->Header.NumColumns; ++i)
    if (Index->ColumnKinds[i] == Sec)
      return &Contributions[i];
  return nullptr;
}